

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O3

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertSOSCollection
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ArrayRef<int> *sosno,ArrayRef<double> *ref,bool fAllSOS2)

{
  _Rb_tree_node_base *args;
  double dVar1;
  _Rb_tree_color _Var2;
  _Base_ptr __n;
  _Rb_tree_color _Var3;
  SOSExtraInfo ei;
  pointer piVar4;
  pointer piVar5;
  uint uVar6;
  uint uVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  long *plVar10;
  _Base_ptr p_Var11;
  Error *pEVar12;
  ulong uVar13;
  long *plVar14;
  size_type *psVar15;
  uint uVar16;
  long lVar17;
  double *in_R8;
  long lVar18;
  size_t sVar19;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_int>_>,_bool> pVar20;
  vector<int,_std::allocator<int>_> vars;
  vector<double,_std::allocator<double>_> weights;
  map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
  sos_map;
  long *local_208;
  ulong local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  vector<int,_std::allocator<int>_> local_1c8;
  void *local_1a8;
  double *pdStack_1a0;
  double *local_198;
  double local_188;
  double local_180;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *local_178;
  string local_170;
  string local_150;
  SOS_1or2_Constraint<2> local_130;
  long local_d0;
  char *local_c8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  sVar19 = ref->size_;
  local_178 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (sVar19 != 0) {
    lVar17 = sVar19 * -8;
    lVar18 = sVar19 * 4;
    do {
      lVar18 = lVar18 + -4;
      lVar17 = lVar17 + 8;
      if (*(int *)((long)sosno->data_ + lVar18) != 0) {
        pmVar8 = std::
                 map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
                 ::operator[]((map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
                               *)&local_60,(key_type_conflict *)((long)sosno->data_ + lVar18));
        local_130.super_BasicConstraint.name_._M_dataplus._M_p =
             *(pointer *)((long)ref->data_ + lVar18 * 2);
        local_130.super_BasicConstraint.name_._M_string_length._0_4_ = (int)sVar19 + -1;
        pVar20 = std::
                 _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                 ::_M_insert_unique<std::pair<double_const,int>>
                           ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                             *)&pmVar8->second,(pair<const_double,_int> *)&local_130);
        if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          if (((!fAllSOS2) || (dVar1 = *(double *)((long)ref->data_ + lVar18 * 2), dVar1 != 0.0)) ||
             (NAN(dVar1))) {
            pEVar12 = (Error *)__cxa_allocate_exception(0x18);
            fmt::format<int,double>
                      ((string *)&local_130,(fmt *)"SOS/SOS2 constraint {} has repeated weight {}",
                       (char *)(lVar18 + (long)sosno->data_),(int *)((long)ref->data_ - lVar17),
                       in_R8);
            Error::Error(pEVar12,(CStringRef)local_130.super_BasicConstraint.name_._M_dataplus._M_p,
                         -1);
            __cxa_throw(pEVar12,&Error::typeinfo,fmt::SystemError::~SystemError);
          }
          pmVar8->first = pmVar8->first + 1;
        }
      }
      sVar19 = sVar19 - 1;
    } while (sVar19 != 0);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      local_180 = 1.0;
      local_188 = 1.0;
      if (!fAllSOS2) {
        local_188 = -1e+100;
        local_180 = 1e+100;
      }
      local_c8 = "SOS2_";
      if (fAllSOS2) {
        local_c8 = "SOS2_PL_";
      }
      local_d0 = (ulong)fAllSOS2 * 3 + 5;
      p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        args = p_Var11 + 1;
        __n = p_Var11[2]._M_right;
        if (((__n != (_Base_ptr)0x0) && (*(int *)&p_Var11[1]._M_parent != 0)) &&
           ((*(double *)(p_Var11[2]._M_parent + 1) != 0.0 ||
            (NAN(*(double *)(p_Var11[2]._M_parent + 1)))))) {
          pEVar12 = (Error *)__cxa_allocate_exception(0x18);
          fmt::format<int>((string *)&local_130,(CStringRef)0x49f49c,(int *)args);
          Error::Error(pEVar12,(CStringRef)local_130.super_BasicConstraint.name_._M_dataplus._M_p,-1
                      );
          __cxa_throw(pEVar12,&Error::typeinfo,fmt::SystemError::~SystemError);
        }
        if ((_Base_ptr)0x1 < __n) {
          local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          std::vector<int,_std::allocator<int>_>::reserve(&local_1c8,(size_type)__n);
          local_1a8 = (void *)0x0;
          pdStack_1a0 = (double *)0x0;
          local_198 = (double *)0x0;
          std::vector<double,_std::allocator<double>_>::reserve
                    ((vector<double,_std::allocator<double>_> *)&local_1a8,
                     (size_type)p_Var11[2]._M_right);
          for (p_Var9 = p_Var11[2]._M_parent; p_Var9 != (_Rb_tree_node_base *)&p_Var11[1]._M_right;
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
            if (pdStack_1a0 == local_198) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&local_1a8,(iterator)pdStack_1a0,
                         (double *)(p_Var9 + 1));
            }
            else {
              *pdStack_1a0 = *(double *)(p_Var9 + 1);
              pdStack_1a0 = pdStack_1a0 + 1;
            }
            if (local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_1c8,
                         (iterator)
                         local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&p_Var9[1]._M_parent);
            }
            else {
              *local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = *(int *)&p_Var9[1]._M_parent;
              local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          if ((int)args->_M_color < 0 || fAllSOS2) {
            std::vector<int,_std::allocator<int>_>::vector(&local_78,&local_1c8);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_90,(vector<double,_std::allocator<double>_> *)&local_1a8);
            _Var2 = args->_M_color;
            _Var3 = -_Var2;
            if (0 < (int)_Var2) {
              _Var3 = _Var2;
            }
            uVar16 = 1;
            if (9 < _Var3) {
              uVar13 = (ulong)_Var3;
              uVar6 = 4;
              do {
                uVar16 = uVar6;
                uVar7 = (uint)uVar13;
                if (uVar7 < 100) {
                  uVar16 = uVar16 - 2;
                  goto LAB_003f3455;
                }
                if (uVar7 < 1000) {
                  uVar16 = uVar16 - 1;
                  goto LAB_003f3455;
                }
                if (uVar7 < 10000) goto LAB_003f3455;
                uVar13 = uVar13 / 10000;
                uVar6 = uVar16 + 4;
              } while (99999 < uVar7);
              uVar16 = uVar16 + 1;
            }
LAB_003f3455:
            local_1e8[0] = local_1d8;
            std::__cxx11::string::_M_construct
                      ((ulong)local_1e8,(char)uVar16 - (char)((int)_Var2 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(_Var2 >> 0x1f) + (long)local_1e8[0]),uVar16,_Var3);
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)local_1e8,0,(char *)0x0,(ulong)local_c8);
            plVar14 = plVar10 + 2;
            if ((long *)*plVar10 == plVar14) {
              local_1f8 = *plVar14;
              lStack_1f0 = plVar10[3];
              local_208 = &local_1f8;
            }
            else {
              local_1f8 = *plVar14;
              local_208 = (long *)*plVar10;
            }
            local_200 = plVar10[1];
            *plVar10 = (long)plVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                                        ((ulong)&local_208,local_200,0,'\x01');
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            psVar15 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_150.field_2._M_allocated_capacity = *psVar15;
              local_150.field_2._8_8_ = plVar10[3];
            }
            else {
              local_150.field_2._M_allocated_capacity = *psVar15;
              local_150._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_150._M_string_length = plVar10[1];
            *plVar10 = (long)psVar15;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            ei.bounds_.ub_ = local_180;
            ei.bounds_.lb_ = local_188;
            SOS_1or2_Constraint<2>::
            SOS_1or2_Constraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>>
                      (&local_130,&local_78,&local_90,ei,&local_150);
            ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
            ::AddConstraint<mp::SOS_1or2_Constraint<2>>
                      ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                        *)local_178,&local_130);
            if (local_130.w_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_130.w_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_130.w_.super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_130.w_.super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_130.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_130.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_130.v_.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_130.v_.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130.super_BasicConstraint.name_._M_dataplus._M_p !=
                &local_130.super_BasicConstraint.name_.field_2) {
              operator_delete(local_130.super_BasicConstraint.name_._M_dataplus._M_p,
                              local_130.super_BasicConstraint.name_.field_2._M_allocated_capacity +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208,local_1f8 + 1);
            }
            if (local_1e8[0] != local_1d8) {
              operator_delete(local_1e8[0],local_1d8[0] + 1);
            }
            piVar4 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar5 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_90.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_90.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
              piVar4 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar5 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
          }
          else {
            std::vector<int,_std::allocator<int>_>::vector(&local_a8,&local_1c8);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_c0,(vector<double,_std::allocator<double>_> *)&local_1a8);
            _Var2 = args->_M_color;
            _Var3 = -_Var2;
            if (0 < (int)_Var2) {
              _Var3 = _Var2;
            }
            uVar16 = 1;
            if (9 < _Var3) {
              uVar13 = (ulong)_Var3;
              uVar6 = 4;
              do {
                uVar16 = uVar6;
                uVar7 = (uint)uVar13;
                if (uVar7 < 100) {
                  uVar16 = uVar16 - 2;
                  goto LAB_003f36ac;
                }
                if (uVar7 < 1000) {
                  uVar16 = uVar16 - 1;
                  goto LAB_003f36ac;
                }
                if (uVar7 < 10000) goto LAB_003f36ac;
                uVar13 = uVar13 / 10000;
                uVar6 = uVar16 + 4;
              } while (99999 < uVar7);
              uVar16 = uVar16 + 1;
            }
LAB_003f36ac:
            local_1e8[0] = local_1d8;
            std::__cxx11::string::_M_construct
                      ((ulong)local_1e8,(char)uVar16 - (char)((int)_Var2 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(_Var2 >> 0x1f) + (long)local_1e8[0]),uVar16,_Var3);
            plVar10 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x49f4d9)
            ;
            plVar14 = plVar10 + 2;
            if ((long *)*plVar10 == plVar14) {
              local_1f8 = *plVar14;
              lStack_1f0 = plVar10[3];
              local_208 = &local_1f8;
            }
            else {
              local_1f8 = *plVar14;
              local_208 = (long *)*plVar10;
            }
            local_200 = plVar10[1];
            *plVar10 = (long)plVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                                        ((ulong)&local_208,local_200,0,'\x01');
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            psVar15 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_170.field_2._M_allocated_capacity = *psVar15;
              local_170.field_2._8_8_ = plVar10[3];
            }
            else {
              local_170.field_2._M_allocated_capacity = *psVar15;
              local_170._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_170._M_string_length = plVar10[1];
            *plVar10 = (long)psVar15;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            SOS_1or2_Constraint<1>::
            SOS_1or2_Constraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>>
                      ((SOS_1or2_Constraint<1> *)&local_130,&local_a8,&local_c0,&local_170);
            ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
            ::AddConstraint<mp::SOS_1or2_Constraint<1>>
                      ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                        *)local_178,(SOS_1or2_Constraint<1> *)&local_130);
            if (local_130.w_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_130.w_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_130.w_.super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_130.w_.super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_130.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_130.v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_130.v_.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_130.v_.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130.super_BasicConstraint.name_._M_dataplus._M_p !=
                &local_130.super_BasicConstraint.name_.field_2) {
              operator_delete(local_130.super_BasicConstraint.name_._M_dataplus._M_p,
                              local_130.super_BasicConstraint.name_.field_2._M_allocated_capacity +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208,local_1f8 + 1);
            }
            if (local_1e8[0] != local_1d8) {
              operator_delete(local_1e8[0],local_1d8[0] + 1);
            }
            piVar4 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar5 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_c0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
              piVar4 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar5 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
          }
          if (piVar4 != (pointer)0x0) {
            operator_delete(piVar4,(long)piVar5 - (long)piVar4);
          }
          if (local_1a8 != (void *)0x0) {
            operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
          }
          if (local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != &local_60._M_impl.super__Rb_tree_header);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void ConvertSOSCollection(ArrayRef<int> sosno, ArrayRef<double> ref,
                            bool fAllSOS2) {
    assert(sosno.size() == ref.size());
    std::map< int,       // pair.first: N repeated zeros
        std::pair< int, std::map< double, int > > > sos_map;
    for (auto i=ref.size(); i--; )
      if (sosno[i]) {
        auto& sos_group = sos_map[sosno[i]];
        if (!sos_group.second.insert( {ref[i], i} ).second) {
          if (!fAllSOS2 || ref[i]) // weights 0 for all: redundant PL linearization
            MP_RAISE(
                  fmt::format(
                    "SOS/SOS2 constraint {} has repeated weight {}",
                    sosno[i], ref[i]));
          else
            ++sos_group.first;
        }
      }
    for (const auto& group: sos_map) {
      if (group.second.second.size()
          && group.second.first
          && group.second.second.begin()->first)  // key non-0
        MP_RAISE(
              fmt::format(
                "SOS/SOS2 constraint {} has repeated 0 weights", group.first));
      if (group.second.second.size()>1) {
        std::vector<int> vars;
        vars.reserve(group.second.second.size());
        std::vector<double> weights;
        weights.reserve(group.second.second.size());
        for (const auto& wv: group.second.second) {
          weights.push_back(wv.first);
          vars.push_back(wv.second);
        }
        if (group.first<0 || fAllSOS2)
          AddConstraint(
                SOS2Constraint(vars, weights,
                               fAllSOS2 ?    // for linearized PL
                                             SOSExtraInfo{{1.0, 1.0}} :
                                             SOSExtraInfo{},
                               (fAllSOS2 ? "SOS2_PL_" : "SOS2_")
                               + std::to_string(group.first)
                               + '_'));
        else
          AddConstraint(
                SOS1Constraint(vars, weights,
                               "SOS1_"
                               + std::to_string(group.first)
                               + '_'));
      }
    }
  }